

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mutable_s2shape_index.cc
# Opt level: O0

void MutableS2ShapeIndex::GetBatchSizes
               (int num_items,int max_batches,double final_bytes_per_item,double tmp_bytes_per_item,
               double tmp_memory_budget_bytes,vector<int,_std::allocator<int>_> *batch_sizes)

{
  double *pdVar1;
  int *piVar2;
  size_type sVar3;
  ostream *poVar4;
  double dVar5;
  double dVar6;
  S2LogMessage local_88;
  S2LogMessageVoidify local_75;
  int local_74;
  int local_70;
  int local_6c;
  int batch_items;
  int i;
  double max_batch_items;
  double local_58;
  double local_50;
  double total_budget_bytes;
  double free_space_multiplier;
  double final_bytes_ratio;
  double final_bytes;
  vector<int,_std::allocator<int>_> *batch_sizes_local;
  double tmp_memory_budget_bytes_local;
  double tmp_bytes_per_item_local;
  double final_bytes_per_item_local;
  int max_batches_local;
  int num_items_local;
  
  dVar5 = (double)num_items * final_bytes_per_item;
  free_space_multiplier = final_bytes_per_item / tmp_bytes_per_item;
  total_budget_bytes = 1.0 - free_space_multiplier;
  local_58 = dVar5 + tmp_memory_budget_bytes;
  final_bytes_ratio = dVar5;
  final_bytes = (double)batch_sizes;
  batch_sizes_local = (vector<int,_std::allocator<int>_> *)tmp_memory_budget_bytes;
  tmp_memory_budget_bytes_local = tmp_bytes_per_item;
  tmp_bytes_per_item_local = final_bytes_per_item;
  final_bytes_per_item_local._0_4_ = max_batches;
  final_bytes_per_item_local._4_4_ = num_items;
  dVar6 = pow(total_budget_bytes,(double)max_batches);
  max_batch_items = dVar5 / (1.0 - dVar6);
  pdVar1 = std::max<double>(&local_58,&max_batch_items);
  local_50 = *pdVar1;
  _batch_items = local_50 / tmp_memory_budget_bytes_local;
  std::vector<int,_std::allocator<int>_>::clear((vector<int,_std::allocator<int>_> *)final_bytes);
  for (local_6c = 0;
      local_6c + 1 < final_bytes_per_item_local._0_4_ && 0 < final_bytes_per_item_local._4_4_;
      local_6c = local_6c + 1) {
    local_74 = (int)(_batch_items + 1.0);
    piVar2 = std::min<int>((int *)((long)&final_bytes_per_item_local + 4),&local_74);
    local_70 = *piVar2;
    std::vector<int,_std::allocator<int>_>::push_back
              ((vector<int,_std::allocator<int>_> *)final_bytes,&local_70);
    final_bytes_per_item_local._4_4_ = final_bytes_per_item_local._4_4_ - local_70;
    _batch_items = total_budget_bytes * _batch_items;
  }
  sVar3 = std::vector<int,_std::allocator<int>_>::size
                    ((vector<int,_std::allocator<int>_> *)final_bytes);
  if (sVar3 <= (ulong)(long)final_bytes_per_item_local._0_4_) {
    return;
  }
  S2FatalLogMessage::S2FatalLogMessage
            ((S2FatalLogMessage *)&local_88,
             "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/mutable_s2shape_index.cc"
             ,0x2c5,kFatal,(ostream *)&std::cerr);
  poVar4 = S2LogMessage::stream(&local_88);
  poVar4 = std::operator<<(poVar4,"Check failed: (batch_sizes->size()) <= (max_batches) ");
  S2LogMessageVoidify::operator&(&local_75,poVar4);
  S2FatalLogMessage::~S2FatalLogMessage((S2FatalLogMessage *)&local_88);
}

Assistant:

void MutableS2ShapeIndex::GetBatchSizes(int num_items, int max_batches,
                                        double final_bytes_per_item,
                                        double tmp_bytes_per_item,
                                        double tmp_memory_budget_bytes,
                                        vector<int>* batch_sizes) {
  // This code tries to fit all the data into the same memory space
  // ("total_budget_bytes") at every iteration.  The data consists of some
  // number of processed items (at "final_bytes_per_item" each), plus some
  // number being updated (at "tmp_bytes_per_item" each).  The space occupied
  // by the items being updated is the "free space".  At each iteration, the
  // free space is multiplied by (1 - final_bytes_per_item/tmp_bytes_per_item)
  // as the items are converted into their final form.
  double final_bytes = num_items * final_bytes_per_item;
  double final_bytes_ratio = final_bytes_per_item / tmp_bytes_per_item;
  double free_space_multiplier = 1 - final_bytes_ratio;

  // The total memory budget is the greater of the final size plus the allowed
  // temporary memory, or the minimum amount of memory required to limit the
  // number of batches to "max_batches".
  double total_budget_bytes = max(
      final_bytes + tmp_memory_budget_bytes,
      final_bytes / (1 - pow(free_space_multiplier, max_batches)));

  // "max_batch_items" is the number of items in the current batch.
  double max_batch_items = total_budget_bytes / tmp_bytes_per_item;
  batch_sizes->clear();
  for (int i = 0; i + 1 < max_batches && num_items > 0; ++i) {
    int batch_items =
        std::min(num_items, static_cast<int>(max_batch_items + 1));
    batch_sizes->push_back(batch_items);
    num_items -= batch_items;
    max_batch_items *= free_space_multiplier;
  }
  S2_DCHECK_LE(batch_sizes->size(), max_batches);
}